

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>::fastAccessDx
          (FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_> *this,
          int i)

{
  value_type_conflict1 *pvVar1;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *in_RDI;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  
  vVar2 = FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::fastAccessDx
                    (in_RDI,in_stack_ffffffffffffffdc);
  pvVar1 = FadCst<double>::val((FadCst<double> *)&(in_RDI->fadexpr_).right_);
  return vVar2 * *pvVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val();}